

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::copy(Fl_Text_Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int nInserted;
  int extraout_EAX;
  int in_ECX;
  int iVar1;
  int iVar2;
  int in_R8D;
  int part1Length;
  int copiedLength;
  int toPos_local;
  int fromEnd_local;
  int fromStart_local;
  Fl_Text_Buffer *fromBuf_local;
  Fl_Text_Buffer *this_local;
  
  iVar2 = (int)src;
  nInserted = in_ECX - iVar2;
  if (this->mGapEnd - this->mGapStart < nInserted) {
    reallocate_with_gap(this,in_R8D,nInserted + this->mPreferredGapSize);
  }
  else if (in_R8D != this->mGapStart) {
    move_gap(this,in_R8D);
  }
  if (*(int *)(dst + 0x40) < in_ECX) {
    if (iVar2 < *(int *)(dst + 0x40)) {
      iVar1 = *(int *)(dst + 0x40) - iVar2;
      memcpy(this->mBuf + in_R8D,(void *)(*(long *)(dst + 0x38) + (long)iVar2),(long)iVar1);
      memcpy(this->mBuf + (in_R8D + iVar1),
             (void *)(*(long *)(dst + 0x38) + (long)*(int *)(dst + 0x44)),(long)(nInserted - iVar1))
      ;
    }
    else {
      memcpy(this->mBuf + in_R8D,
             (void *)(*(long *)(dst + 0x38) +
                     (long)(iVar2 + (*(int *)(dst + 0x44) - *(int *)(dst + 0x40)))),(long)nInserted)
      ;
    }
  }
  else {
    memcpy(this->mBuf + in_R8D,(void *)(*(long *)(dst + 0x38) + (long)iVar2),(long)nInserted);
  }
  this->mGapStart = nInserted + this->mGapStart;
  this->mLength = nInserted + this->mLength;
  update_selections(this,in_R8D,0,nInserted);
  return extraout_EAX;
}

Assistant:

void Fl_Text_Buffer::copy(Fl_Text_Buffer * fromBuf, int fromStart,
			  int fromEnd, int toPos)
{
  IS_UTF8_ALIGNED2(fromBuf, fromStart)
  IS_UTF8_ALIGNED2(fromBuf, fromEnd)
  IS_UTF8_ALIGNED2(this, (toPos))
  
  int copiedLength = fromEnd - fromStart;
  
  /* Prepare the buffer to receive the new text.  If the new text fits in
   the current buffer, just move the gap (if necessary) to where
   the text should be inserted.  If the new text is too large, reallocate
   the buffer with a gap large enough to accomodate the new text and a
   gap of mPreferredGapSize */
  if (copiedLength > mGapEnd - mGapStart)
    reallocate_with_gap(toPos, copiedLength + mPreferredGapSize);
  else if (toPos != mGapStart)
    move_gap(toPos);
  
  /* Insert the new text (toPos now corresponds to the start of the gap) */
  if (fromEnd <= fromBuf->mGapStart) {
    memcpy(&mBuf[toPos], &fromBuf->mBuf[fromStart], copiedLength);
  } else if (fromStart >= fromBuf->mGapStart) {
    memcpy(&mBuf[toPos],
	   &fromBuf->mBuf[fromStart + (fromBuf->mGapEnd - fromBuf->mGapStart)],
	   copiedLength);
  } else {
    int part1Length = fromBuf->mGapStart - fromStart;
    memcpy(&mBuf[toPos], &fromBuf->mBuf[fromStart], part1Length);
    memcpy(&mBuf[toPos + part1Length],
	   &fromBuf->mBuf[fromBuf->mGapEnd], copiedLength - part1Length);
  }
  mGapStart += copiedLength;
  mLength += copiedLength;
  update_selections(toPos, 0, copiedLength);
}